

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_view.cc
# Opt level: O3

size_type __thiscall absl::string_view::rfind(string_view *this,string_view s,size_type pos)

{
  ulong uVar1;
  char *pcVar2;
  size_type sVar3;
  ulong uVar4;
  char *pcVar5;
  
  uVar4 = s.length_;
  uVar1 = this->length_;
  sVar3 = 0xffffffffffffffff;
  if (uVar4 <= uVar1) {
    if (uVar4 == 0) {
      sVar3 = pos;
      if (uVar1 < pos) {
        sVar3 = uVar1;
      }
    }
    else {
      if (uVar1 - uVar4 < pos) {
        pos = uVar1 - uVar4;
      }
      pcVar5 = this->ptr_ + uVar4 + pos;
      pcVar2 = std::__find_end<char_const*,char_const*,__gnu_cxx::__ops::_Iter_equal_to_iter>
                         (this->ptr_,pcVar5,s.ptr_,s.ptr_ + uVar4);
      sVar3 = 0xffffffffffffffff;
      if (pcVar2 != pcVar5) {
        sVar3 = (long)pcVar2 - (long)this->ptr_;
      }
    }
  }
  return sVar3;
}

Assistant:

string_view::size_type string_view::rfind(string_view s, size_type pos) const
    noexcept {
  if (length_ < s.length_) return npos;
  if (s.empty()) return std::min(length_, pos);
  const char* last = ptr_ + std::min(length_ - s.length_, pos) + s.length_;
  const char* result = std::find_end(ptr_, last, s.ptr_, s.ptr_ + s.length_);
  return result != last ? result - ptr_ : npos;
}